

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.h
# Opt level: O1

unique_ptr<BaseTest,_std::default_delete<BaseTest>_> __thiscall
TestFactory::createTest<(TestFactory::Type)1,int>(TestFactory *this,int args)

{
  BaseTest *this_00;
  pointer *__ptr;
  
  *(undefined8 *)this = 0;
  this_00 = (BaseTest *)operator_new(0x40);
  BaseTest::BaseTest(this_00,args);
  this_00->_vptr_BaseTest = (_func_int **)&PTR_generate_0010ed38;
  *(BaseTest **)this = this_00;
  DistinctIntTest::generate((DistinctIntTest *)this_00);
  return (__uniq_ptr_data<BaseTest,_std::default_delete<BaseTest>,_true,_true>)
         (__uniq_ptr_data<BaseTest,_std::default_delete<BaseTest>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<BaseTest>
	createTest(Args... args)
	{
		std::unique_ptr<BaseTest> ret;
		if constexpr (T == RandomDouble)
			ret = std::make_unique<RandomDoubleTest>(std::forward<Args>(args)...);
		else if constexpr (T == DistinctInt)
			ret = std::make_unique<DistinctIntTest>(std::forward<Args>(args)...);
		else if constexpr (T == Generator)
			ret = std::make_unique<GeneratorTest>(std::forward<Args>(args)...);
		ret->generate();
		return ret;
	}